

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O2

HalfedgeHandle __thiscall
OpenMesh::ArrayKernel::new_edge(ArrayKernel *this,VertexHandle _start_vh,VertexHandle _end_vh)

{
  int iVar1;
  EdgeHandle EVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Halfedge *pHVar3;
  Edge local_58;
  
  local_58.halfedges_[1].super_Halfedge_without_prev.face_handle_.super_BaseHandle.idx_ =
       (BaseHandle)-1;
  local_58.halfedges_[1].super_Halfedge_without_prev.vertex_handle_.super_BaseHandle.idx_ =
       (BaseHandle)-1;
  local_58.halfedges_[1].super_Halfedge_without_prev.next_halfedge_handle_.super_BaseHandle.idx_ =
       (BaseHandle)-1;
  local_58.halfedges_[1].prev_halfedge_handle_.super_BaseHandle.idx_ = (BaseHandle)-1;
  local_58.halfedges_[0].super_Halfedge_without_prev.face_handle_.super_BaseHandle.idx_ =
       (BaseHandle)-1;
  local_58.halfedges_[0].super_Halfedge_without_prev.vertex_handle_.super_BaseHandle.idx_ =
       (BaseHandle)-1;
  local_58.halfedges_[0].super_Halfedge_without_prev.next_halfedge_handle_.super_BaseHandle.idx_ =
       (BaseHandle)-1;
  local_58.halfedges_[0].prev_halfedge_handle_.super_BaseHandle.idx_ = (BaseHandle)-1;
  std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::
  emplace_back<OpenMesh::ArrayItems::Edge>(&this->edges_,&local_58);
  iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[4])(this);
  PropertyContainer::resize(&(this->super_BaseKernel).eprops_,CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[3])(this);
  PropertyContainer::resize(&(this->super_BaseKernel).hprops_,CONCAT44(extraout_var_00,iVar1));
  EVar2 = handle(this,(this->edges_).
                      super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1);
  pHVar3 = halfedge(this,(HalfedgeHandle)(EVar2.super_BaseHandle.idx_ * 2).idx_);
  (pHVar3->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_ =
       (int)_end_vh.super_BaseHandle.idx_;
  pHVar3 = halfedge(this,(HalfedgeHandle)((int)EVar2.super_BaseHandle.idx_ * 2 + 1));
  (pHVar3->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_ =
       (int)_start_vh.super_BaseHandle.idx_;
  return (BaseHandle)(BaseHandle)(EVar2.super_BaseHandle.idx_ * 2).idx_;
}

Assistant:

inline HalfedgeHandle new_edge(VertexHandle _start_vh, VertexHandle _end_vh)
  {
//     assert(_start_vh != _end_vh);
    edges_.push_back(Edge());
    eprops_resize(n_edges());//TODO:should it be push_back()?
    hprops_resize(n_halfedges());//TODO:should it be push_back()?

    EdgeHandle eh(handle(edges_.back()));
    HalfedgeHandle heh0(halfedge_handle(eh, 0));
    HalfedgeHandle heh1(halfedge_handle(eh, 1));
    set_vertex_handle(heh0, _end_vh);
    set_vertex_handle(heh1, _start_vh);
    return heh0;
  }